

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::fill(CImg<unsigned_int> *this,uint *val)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint *__s;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  long lVar10;
  uint *puVar11;
  ulong uVar12;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  
  auVar8 = _DAT_002540b0;
  auVar7 = _DAT_00254090;
  auVar6 = _DAT_00254080;
  __s = this->_data;
  uVar1 = this->_width;
  uVar2 = this->_height;
  uVar3 = this->_depth;
  uVar4 = this->_spectrum;
  if (uVar4 != 0 && ((uVar3 != 0 && uVar2 != 0) && (uVar1 != 0 && __s != (uint *)0x0))) {
    uVar5 = *val;
    if (uVar5 == 0) {
      memset(__s,0,(ulong)uVar3 * (ulong)uVar4 * (ulong)uVar1 * (ulong)uVar2 * 4);
    }
    else {
      lVar10 = (ulong)uVar3 * (ulong)uVar4 * (ulong)uVar2 * (ulong)uVar1;
      if (0 < lVar10) {
        puVar11 = __s + 1;
        if (__s + 1 < __s + lVar10) {
          puVar11 = __s + lVar10;
        }
        uVar9 = ~(ulong)__s + (long)puVar11;
        auVar16._8_4_ = (int)uVar9;
        auVar16._0_8_ = uVar9;
        auVar16._12_4_ = (int)(uVar9 >> 0x20);
        auVar13._0_8_ = uVar9 >> 2;
        auVar13._8_8_ = auVar16._8_8_ >> 2;
        uVar12 = 0;
        auVar13 = auVar13 ^ _DAT_00254090;
        do {
          auVar15._8_4_ = (int)uVar12;
          auVar15._0_8_ = uVar12;
          auVar15._12_4_ = (int)(uVar12 >> 0x20);
          auVar16 = (auVar15 | auVar6) ^ auVar7;
          iVar14 = auVar13._4_4_;
          if ((bool)(~(auVar16._4_4_ == iVar14 && auVar13._0_4_ < auVar16._0_4_ ||
                      iVar14 < auVar16._4_4_) & 1)) {
            __s[uVar12] = uVar5;
          }
          if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
              auVar16._12_4_ <= auVar13._12_4_) {
            __s[uVar12 + 1] = uVar5;
          }
          auVar16 = (auVar15 | auVar8) ^ auVar7;
          iVar17 = auVar16._4_4_;
          if (iVar17 <= iVar14 && (iVar17 != iVar14 || auVar16._0_4_ <= auVar13._0_4_)) {
            __s[uVar12 + 2] = uVar5;
            __s[uVar12 + 3] = uVar5;
          }
          uVar12 = uVar12 + 4;
        } while (((uVar9 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& fill(const T& val) {
      if (is_empty()) return *this;
      if (val && sizeof(T)!=1) cimg_for(*this,ptrd,T) *ptrd = val;
      else std::memset(_data,(int)(ulongT)val,sizeof(T)*size()); // Double cast to allow val to be (void*)
      return *this;
    }